

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O3

int MOJOSHADER_glAvailableProfiles
              (MOJOSHADER_glGetProcAddress lookup,void *lookup_d,char **profs,int size,
              MOJOSHADER_malloc m,MOJOSHADER_free f,void *malloc_d)

{
  char *profile;
  MOJOSHADER_glContext *pMVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  MOJOSHADER_glContext _ctx;
  MOJOSHADER_glContext MStack_51428;
  
  pMVar1 = ctx;
  ctx = &MStack_51428;
  iVar4 = 0;
  memset(MStack_51428.vs_reg_file_f,0,0x513e0);
  load_extensions(lookup,lookup_d);
  if (ctx->have_opengl_es == 0) {
    if (ctx->have_core_opengl != 0) {
      lVar3 = 0;
      iVar4 = 0;
      do {
        profile = *(char **)((long)profile_priorities + lVar3);
        iVar2 = valid_profile(profile);
        if (iVar2 != 0) {
          if (iVar4 < size) {
            profs[iVar4] = profile;
          }
          iVar4 = iVar4 + 1;
        }
        lVar3 = lVar3 + 8;
      } while (lVar3 != 0x30);
    }
  }
  else {
    *profs = "glsles";
    iVar4 = 1;
    pMVar1 = ctx;
  }
  ctx = pMVar1;
  return iVar4;
}

Assistant:

int MOJOSHADER_glAvailableProfiles(MOJOSHADER_glGetProcAddress lookup,
                                   void *lookup_d,
                                   const char **profs, const int size,
                                   MOJOSHADER_malloc m, MOJOSHADER_free f,
                                   void *malloc_d)
{
    int retval = 0;
    MOJOSHADER_glContext _ctx;
    MOJOSHADER_glContext *current_ctx = ctx;

    if (m == NULL) m = MOJOSHADER_internal_malloc;
    if (f == NULL) f = MOJOSHADER_internal_free;

    ctx = &_ctx;
    memset(ctx, '\0', sizeof (MOJOSHADER_glContext));
    ctx->malloc_fn = m;
    ctx->free_fn = f;
    ctx->malloc_data = malloc_d;

    load_extensions(lookup, lookup_d);

#if SUPPORT_PROFILE_GLSLES
    if (ctx->have_opengl_es)
    {
        profs[0] = MOJOSHADER_PROFILE_GLSLES;
        return 1;
    } // if
#endif

    if (ctx->have_core_opengl)
    {
        size_t i;
        for (i = 0; i < STATICARRAYLEN(profile_priorities); i++)
        {
            const char *profile = profile_priorities[i];
            if (valid_profile(profile))
            {
                if (retval < size)
                    profs[retval] = profile;
                retval++;
            } // if
        } // for
    } // if

    ctx = current_ctx;
    return retval;
}